

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool *this;
  bool *this_00;
  uint64_t __sd;
  ostream *poVar1;
  result_type seed_00;
  undefined1 local_b78 [8];
  RandEngine nextSeed;
  Options options;
  string local_100 [8];
  string WasmFuzzTypesOption;
  optional<unsigned_long> latticeElementSeed;
  optional<unsigned_long> seed;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  functionName;
  Fuzzer local_78 [8];
  Fuzzer fuzzer;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31 [8];
  bool verbose;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,"wasm-fuzz-lattices options",(allocator<char> *)local_b78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b78,"wasm-fuzz-lattices",(allocator<char> *)local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,
             "Fuzz lattices for reflexivity, transitivity, and anti-symmetry, and tranfer functions for monotonicity."
             ,(allocator<char> *)local_58._M_pod_data);
  wasm::Options::Options
            ((Options *)&nextSeed._M_p,(string *)local_b78,
             (string *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged);
  std::__cxx11::string::~string
            ((string *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged);
  std::__cxx11::string::~string((string *)local_b78);
  seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b78,"--seed",
             (allocator<char> *)
             &functionName.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,"",
             (allocator<char> *)(WasmFuzzTypesOption.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"Run a single workload generated by the given seed",local_31);
  local_58._8_8_ = 0;
  local_58._M_unused._M_object =
       &latticeElementSeed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged;
  local_40 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp:1077:15)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp:1077:15)>
             ::_M_manager;
  wasm::Options::add((string *)&nextSeed._M_p,(string *)local_b78,
                     (string *)
                     &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged,(string *)local_78,
                     (Arguments)local_100,(function *)0x1,SUB81(&local_58,0));
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string
            ((string *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged);
  std::__cxx11::string::~string((string *)local_b78);
  latticeElementSeed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
  this = &functionName.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b78,"--lattice-element-seed",(allocator<char> *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,"",local_31);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"Seed which generated the lattice elements to be checked.",&local_32
            );
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp:1087:15)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp:1087:15)>
             ::_M_manager;
  local_58._M_unused._0_8_ =
       (undefined8)(allocator<char> *)(WasmFuzzTypesOption.field_2._M_local_buf + 8);
  wasm::Options::add((string *)&nextSeed._M_p,(string *)local_b78,
                     (string *)
                     &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged,(string *)local_78,
                     (Arguments)local_100,(function *)0x1,SUB81(&local_58,0));
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__cxx11::string::~string((string *)local_78);
  this_00 = &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)local_b78);
  functionName.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b78,"--function-name",local_31)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"",&local_32);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58._M_pod_data,
             "Name of the function in the module generated by --seed to be checked.",&local_33);
  functionName.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = this_00;
  wasm::Options::add((string *)&nextSeed._M_p,(string *)local_b78,(string *)local_78,
                     (string *)local_58._M_pod_data,(Arguments)local_100,(function *)0x1,
                     SUB81(this,0));
  std::_Function_base::~_Function_base((_Function_base *)this);
  std::__cxx11::string::~string((string *)local_58._M_pod_data);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_b78);
  local_31[0] = (allocator<char>)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b78,"--verbose",&local_32);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"-v",&local_33);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58._M_pod_data,"Print extra information",&local_34);
  functionName.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = local_31;
  wasm::Options::add((string *)&nextSeed._M_p,(string *)local_b78,(string *)local_78,
                     (string *)local_58._M_pod_data,(Arguments)local_100,(function *)0x0,
                     SUB81(this,0));
  std::_Function_base::~_Function_base
            ((_Function_base *)
             &functionName.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged);
  std::__cxx11::string::~string((string *)local_58._M_pod_data);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_b78);
  wasm::Options::parse((int)&nextSeed + 0x9c0,(char **)(ulong)(uint)argc);
  local_78[0].verbose = (bool)local_31[0];
  if (seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ == '\x01') {
    if ((latticeElementSeed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ == '\x01') &&
       (functionName.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_1_ == '\x01')) {
      wasm::Fuzzer::run(local_78,latticeElementSeed.super__Optional_base<unsigned_long,_true,_true>.
                                 _M_payload.super__Optional_payload_base<unsigned_long>._8_8_,
                        (uint64_t *)(WasmFuzzTypesOption.field_2._M_local_buf + 8),
                        (string *)
                        &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_long>._M_engaged);
    }
    else {
      wasm::Fuzzer::run(local_78,latticeElementSeed.super__Optional_base<unsigned_long,_true,_true>.
                                 _M_payload.super__Optional_payload_base<unsigned_long>._8_8_,
                        (uint64_t *)0x0,(string *)0x0);
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_engaged);
    wasm::Options::~Options((Options *)&nextSeed._M_p);
    std::__cxx11::string::~string(local_100);
    return 0;
  }
  __sd = wasm::getSeed();
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
          *)local_b78,__sd);
  do {
    poVar1 = std::operator<<((ostream *)&std::cout,"Iteration ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"\n");
    seed_00 = std::
              mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              ::operator()((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                            *)local_b78);
    wasm::Fuzzer::run(local_78,seed_00,(uint64_t *)0x0,(string *)0x0);
  } while( true );
}

Assistant:

int main(int argc, const char* argv[]) {
  using namespace wasm;

  const std::string WasmFuzzTypesOption = "wasm-fuzz-lattices options";

  Options options("wasm-fuzz-lattices",
                  "Fuzz lattices for reflexivity, transitivity, and "
                  "anti-symmetry, and tranfer functions for monotonicity.");

  std::optional<uint64_t> seed;
  options.add("--seed",
              "",
              "Run a single workload generated by the given seed",
              WasmFuzzTypesOption,
              Options::Arguments::One,
              [&](Options*, const std::string& arg) {
                seed = uint64_t(std::stoull(arg));
              });

  std::optional<uint64_t> latticeElementSeed;
  options.add("--lattice-element-seed",
              "",
              "Seed which generated the lattice elements to be checked.",
              WasmFuzzTypesOption,
              Options::Arguments::One,
              [&](Options*, const std::string& arg) {
                latticeElementSeed = uint64_t(std::stoull(arg));
              });

  std::optional<std::string> functionName;
  options.add(
    "--function-name",
    "",
    "Name of the function in the module generated by --seed to be checked.",
    WasmFuzzTypesOption,
    Options::Arguments::One,
    [&](Options*, const std::string& arg) { functionName = arg; });

  bool verbose = false;
  options.add("--verbose",
              "-v",
              "Print extra information",
              WasmFuzzTypesOption,
              Options::Arguments::Zero,
              [&](Options*, const std::string& arg) { verbose = true; });

  options.parse(argc, argv);

  Fuzzer fuzzer{verbose};
  if (seed) {
    if (latticeElementSeed && functionName) {
      // Run test a single function and lattice element seed.
      fuzzer.run(*seed, &(*latticeElementSeed), &(*functionName));
    } else {
      // Run just a single workload with the given seed.
      fuzzer.run(*seed);
    }
  } else {
    // Continuously run workloads with new randomly generated seeds.
    size_t i = 0;
    RandEngine nextSeed(getSeed());
    while (true) {
      std::cout << "Iteration " << ++i << "\n";
      fuzzer.run(nextSeed());
    }
  }
  return 0;
}